

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O3

void Gia_ObjAddFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  uint uVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  int iVar7;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0x77,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((((ulong)pObj & 1) != 0) || (((ulong)pFanout & 1) != 0)) {
    __assert_fail("!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0x78,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pFanout) && (pFanout < pGVar3 + p->nObjs)) {
    iVar8 = (int)((ulong)((long)pFanout - (long)pGVar3) >> 2);
    uVar5 = iVar8 * -0x55555555;
    if ((int)uVar5 < 1) {
      __assert_fail("Gia_ObjId(p, pFanout) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                    ,0x79,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
      iVar7 = (int)((ulong)((long)pObj - (long)pGVar3) >> 2);
      uVar6 = iVar7 * -0x55555555;
      uVar1 = p->nFansAlloc;
      uVar11 = (ulong)uVar1;
      if ((uVar1 == uVar6 || SBORROW4(uVar1,uVar6) != (int)(uVar1 + iVar7 * 0x55555555) < 0) ||
          (int)uVar1 <= (int)uVar5) {
        if (uVar6 != uVar5 && SBORROW4(uVar6,uVar5) == (int)(uVar6 + iVar8 * 0x55555555) < 0) {
          uVar5 = uVar6;
        }
        uVar11 = (long)(int)uVar5 * 2;
        piVar2 = (int *)realloc(p->pFanData,(ulong)(uVar5 * 10) << 2);
        p->pFanData = piVar2;
        memset(piVar2 + (long)p->nFansAlloc * 5,0,(uVar11 - (long)p->nFansAlloc) * 0x14);
        p->nFansAlloc = (int)uVar11;
        pGVar3 = p->pObjs;
      }
      if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
        if ((int)uVar11 <= (int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555) {
LAB_002074c6:
          __assert_fail("Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                        ,0x81,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        if ((pGVar3 <= pFanout) && (pFanout < pGVar3 + p->nObjs)) {
          iVar8 = (int)((ulong)((long)pFanout - (long)pGVar3) >> 2);
          if ((int)uVar11 <= iVar8 * -0x55555555) goto LAB_002074c6;
          uVar5 = Gia_ObjWhatFanin(p,pFanout,pObj);
          if (1 < uVar5) {
            __assert_fail("Num < 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                          ,0x24,"int Gia_FanoutCreate(int, int)");
          }
          pGVar3 = p->pObjs;
          if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
            uVar1 = uVar5 + iVar8 * 0x55555556;
            piVar2 = p->pFanData;
            iVar8 = iVar8 * 0x55555556 >> 1;
            puVar9 = (uint *)(piVar2 + (long)(iVar8 * 5) + (ulong)uVar5 + 1);
            puVar4 = (uint *)(piVar2 + (long)(iVar8 * 5) + (ulong)uVar5 + 3);
            lVar10 = (long)(((ulong)((long)pObj - (long)pGVar3) >> 2) * 0x5555555700000000) >> 0x1e;
            uVar5 = *(uint *)((long)piVar2 + lVar10);
            if (uVar5 == 0) {
              *(uint *)((long)piVar2 + lVar10) = uVar1;
            }
            else {
              uVar6 = piVar2[(long)(((int)uVar5 >> 1) * 5) + (ulong)(uVar5 & 1) + 1];
              if (piVar2[(long)(((int)uVar6 >> 1) * 5) + (ulong)(uVar6 & 1) + 3] != uVar5) {
                __assert_fail("*pNext == *pFirst",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                              ,0x90,"void Gia_ObjAddFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
              }
              *puVar9 = uVar6;
              puVar9 = (uint *)(piVar2 + (long)(((int)uVar5 >> 1) * 5) + (ulong)(uVar5 & 1) + 1);
              *puVar4 = *(uint *)((long)piVar2 + lVar10);
              puVar4 = (uint *)(piVar2 + (long)(((int)uVar6 >> 1) * 5) + (ulong)(uVar6 & 1) + 3);
            }
            *puVar9 = uVar1;
            *puVar4 = uVar1;
            return;
          }
        }
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjAddFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    if ( Gia_ObjId(p, pObj) >= p->nFansAlloc || Gia_ObjId(p, pFanout) >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( Gia_ObjId(p, pObj), Gia_ObjId(p, pFanout) ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Gia_FanoutPrev( p->pFanData, *pFirst );
        pNext = Gia_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}